

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

ExportedTableData *
duckdb::ExportedTableData::Deserialize
          (ExportedTableData *__return_storage_ptr__,Deserializer *deserializer)

{
  ExportedTableData(__return_storage_ptr__);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,1,"table_name",&__return_storage_ptr__->table_name);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,2,"schema_name",&__return_storage_ptr__->schema_name);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,3,"database_name",&__return_storage_ptr__->database_name);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,4,"file_path",&__return_storage_ptr__->file_path);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,5,"not_null_columns",&__return_storage_ptr__->not_null_columns);
  return __return_storage_ptr__;
}

Assistant:

ExportedTableData ExportedTableData::Deserialize(Deserializer &deserializer) {
	ExportedTableData result;
	deserializer.ReadPropertyWithDefault<string>(1, "table_name", result.table_name);
	deserializer.ReadPropertyWithDefault<string>(2, "schema_name", result.schema_name);
	deserializer.ReadPropertyWithDefault<string>(3, "database_name", result.database_name);
	deserializer.ReadPropertyWithDefault<string>(4, "file_path", result.file_path);
	deserializer.ReadPropertyWithDefault<vector<string>>(5, "not_null_columns", result.not_null_columns);
	return result;
}